

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_unexposeRegistry_Test::TestBody
          (IntegrationTest_unexposeRegistry_Test *this)

{
  string *uri;
  Exposer *this_00;
  _Atomic_word *p_Var1;
  int iVar2;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substring;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  undefined8 *puVar3;
  char *pcVar4;
  AssertionResult AVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  shared_ptr<prometheus::Registry> registry;
  string counter_name;
  Response metrics;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_130;
  undefined8 *local_128;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [16];
  AssertHelper local_110;
  undefined8 *local_108;
  AssertHelper local_100 [2];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70 [40];
  _Alloc_hider local_48;
  char local_38 [16];
  
  local_90._M_allocated_capacity = (size_type)&local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"some_counter_total","");
  uri = &(this->super_IntegrationTest).default_metrics_path_;
  IntegrationTest::RegisterSomeCounter
            ((IntegrationTest *)local_e0,(string *)this,(string *)&local_90);
  this_00 = (this->super_IntegrationTest).exposer_._M_t.
            super___uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>.
            _M_t.
            super__Tuple_impl<0UL,_prometheus::Exposer_*,_std::default_delete<prometheus::Exposer>_>
            .super__Head_base<0UL,_prometheus::Exposer_*,_false>._M_head_impl;
  local_70._0_8_ = local_e0._0_8_;
  local_70._8_8_ = local_e0._8_8_;
  if ((_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )local_e0._8_8_ != (GTestFlagSaver *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_e0._8_8_ + 0xc) = *(_Atomic_word *)(local_e0._8_8_ + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_e0._8_8_ + 0xc) = *(_Atomic_word *)(local_e0._8_8_ + 0xc) + 1;
    }
  }
  Exposer::RemoveCollectable(this_00,(weak_ptr<prometheus::Collectable> *)local_70,uri);
  if ((GTestFlagSaver *)local_70._8_8_ != (GTestFlagSaver *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_70._8_8_ + 0xc);
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = *(_Atomic_word *)(local_70._8_8_ + 0xc);
      *(int *)(local_70._8_8_ + 0xc) = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (**(code **)(*(long *)local_70._8_8_ + 0x18))();
    }
  }
  IntegrationTest::FetchMetrics((Response *)local_70,&this->super_IntegrationTest,uri);
  local_100[0].data_._0_4_ = 200;
  AVar5 = testing::internal::CmpHelperEQ<long,int>
                    ((internal *)&local_130,"metrics.code","200",(long *)local_70,(int *)local_100);
  puVar3 = local_128;
  substring._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )AVar5.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  if (local_130._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_128 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_128;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0x98,pcVar4);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    puVar3 = local_128;
    if (local_100[0].data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_100[0].data_ + 8))();
      puVar3 = local_128;
    }
  }
  else {
    if (local_128 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_128 != local_128 + 2) {
        operator_delete((undefined8 *)*local_128);
      }
      operator_delete(puVar3);
      substring._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    testing::HasSubstr<std::__cxx11::string>
              ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_e0 + 0x30),(testing *)local_90._M_local_buf,
               (StringLike<std::__cxx11::basic_string<char>_> *)
               substring._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    local_130._M_head_impl = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_b0.impl_.substring_._M_dataplus._M_p,
               local_b0.impl_.substring_._M_string_length +
               local_b0.impl_.substring_._M_dataplus._M_p);
    local_d0._0_8_ = local_e0 + 0x20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_e0 + 0x10),local_130._M_head_impl,
               (long)local_128 + local_130._M_head_impl);
    if (local_130._M_head_impl != local_120) {
      operator_delete(local_130._M_head_impl);
    }
    local_130._M_head_impl = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_d0._0_8_,(undefined1 *)(local_d0._8_8_ + local_d0._0_8_));
    local_100[0].data_ = (AssertHelperData *)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_130._M_head_impl,(long)local_128 + local_130._M_head_impl);
    if (local_130._M_head_impl != local_120) {
      operator_delete(local_130._M_head_impl);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
    ::operator()(&local_110,(char *)local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1674e8);
    if (local_100[0].data_ != (AssertHelperData *)local_f0) {
      operator_delete(local_100[0].data_);
    }
    if ((undefined1 *)local_d0._0_8_ != local_e0 + 0x20) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.impl_.substring_._M_dataplus._M_p != &local_b0.impl_.substring_.field_2) {
      operator_delete(local_b0.impl_.substring_._M_dataplus._M_p);
    }
    puVar3 = local_108;
    if ((char)local_110.data_ == '\0') {
      testing::Message::Message((Message *)&local_130);
      if (local_108 == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)*local_108;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                 ,0x99,pcVar4);
      testing::internal::AssertHelper::operator=(local_100,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(local_100);
      puVar3 = local_108;
      if (local_130._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_130._M_head_impl + 8))();
        puVar3 = local_108;
      }
    }
  }
  if (puVar3 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar3 != puVar3 + 2) {
      operator_delete((undefined8 *)*puVar3);
    }
    operator_delete(puVar3);
  }
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if ((GTestFlagSaver *)local_70._8_8_ != (GTestFlagSaver *)(local_70 + 0x18)) {
    operator_delete((void *)local_70._8_8_);
  }
  if ((GTestFlagSaver *)local_e0._8_8_ != (GTestFlagSaver *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._0_8_ != &local_80) {
    operator_delete((void *)local_90._0_8_);
  }
  return;
}

Assistant:

TEST_F(IntegrationTest, unexposeRegistry) {
  const std::string counter_name = "some_counter_total";
  const auto registry =
      RegisterSomeCounter(counter_name, default_metrics_path_);

  exposer_->RemoveCollectable(registry, default_metrics_path_);

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, Not(HasSubstr(counter_name)));
}